

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_struct_default_trait_impl
          (t_rs_generator *this,string *struct_name,t_struct *tstruct)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  pointer pptVar3;
  t_field *tfield;
  bool bVar4;
  ostream *poVar5;
  pointer pptVar6;
  t_rs_generator *this_00;
  pointer pptVar7;
  string member_name;
  string local_90;
  string local_70;
  string local_50;
  
  pptVar7 = (tstruct->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar3 = (tstruct->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar7 == pptVar3) {
    bVar4 = false;
  }
  else {
    do {
      bVar4 = false;
      pptVar6 = pptVar7 + 1;
      if ((*pptVar7)->req_ + ~T_OPT_IN_REQ_OUT < 0xfffffffe) {
        bVar4 = true;
        break;
      }
      pptVar7 = pptVar6;
    } while (pptVar6 != pptVar3);
  }
  if (!bVar4) {
    poVar1 = &this->f_gen_;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"impl Default for ",0x11);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,(struct_name->_M_dataplus)._M_p,
                        struct_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," {",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + 1;
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"fn default() -> Self {",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + 1;
    if ((tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(struct_name->_M_dataplus)._M_p,struct_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{}",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(struct_name->_M_dataplus)._M_p,struct_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      piVar2 = &(this->super_t_generator).indent_;
      *piVar2 = *piVar2 + 1;
      for (pptVar7 = (tstruct->members_in_id_order_).
                     super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pptVar7 !=
          (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
        tfield = *pptVar7;
        rust_field_name_abi_cxx11_(&local_90,this,tfield);
        t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
        this_00 = (t_rs_generator *)0x399728;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        opt_in_req_out_value_abi_cxx11_(&local_70,this_00,tfield->type_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      piVar2 = &(this->super_t_generator).indent_;
      *piVar2 = *piVar2 + -1;
      t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + -1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  return;
}

Assistant:

void t_rs_generator::render_struct_default_trait_impl(const string& struct_name, t_struct* tstruct) {
  bool has_required_field = false;

  const vector<t_field*>& members = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator members_iter;
  for (members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
    t_field* member = *members_iter;
    if (!is_optional(member->get_req())) {
      has_required_field = true;
      break;
    }
  }

  if (has_required_field) {
    return;
  }

  f_gen_ << "impl Default for " << struct_name << " {" << endl;
  indent_up();
  f_gen_ << indent() << "fn default() -> Self {" << endl;
  indent_up();

  if (members.empty()) {
    f_gen_ << indent() << struct_name << "{}" << endl;
  } else {
    f_gen_ << indent() << struct_name << "{" << endl;
    indent_up();
    for (members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
      t_field *member = (*members_iter);
      string member_name(rust_field_name(member));
      f_gen_ << indent() << member_name << ": " << opt_in_req_out_value(member->get_type()) << "," << endl;
    }
    indent_down();
    f_gen_ << indent() << "}" << endl;
  }

  indent_down();
  f_gen_ << indent() << "}" << endl;
  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}